

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-arch.c
# Opt level: O1

void fill_segment_default(argon2_instance_t *instance,argon2_position_t position)

{
  uint uVar1;
  block *pbVar2;
  bool bVar3;
  uint32_t uVar4;
  uint64_t *puVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 unaff_RBP;
  ulong uVar8;
  uint uVar9;
  block zero_block;
  block input_block;
  block address_block;
  argon2_position_t local_c50;
  uint local_c40;
  uint local_c3c;
  ulong local_c38;
  block local_c30;
  block local_830;
  block local_430;
  
  if (instance != (argon2_instance_t *)0x0) {
    uVar8 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    if (((instance->type != Argon2_i) && (uVar8 = 0, instance->type == Argon2_id)) &&
       (local_c50.pass = position.pass, local_c50.pass == 0)) {
      local_c50.slice = position.slice;
      uVar8 = (ulong)(local_c50.slice < 2);
    }
    local_c50._0_8_ = position._0_8_;
    local_c50._8_8_ = position._8_8_;
    if ((byte)uVar8 != 0) {
      init_block_value(&local_c30,'\0');
      init_block_value(&local_830,'\0');
      local_830.v[0] = local_c50._0_8_ & 0xffffffff;
      local_830.v[1] = (ulong)local_c50._0_8_ >> 0x20;
      local_830.v[2] = local_c50._8_8_ & 0xff;
      local_830.v[3] = (uint64_t)instance->memory_blocks;
      local_830.v[4] = (uint64_t)instance->passes;
      local_830.v[5] = (uint64_t)instance->type;
    }
    bVar3 = local_c50.slice == '\0' && local_c50.pass == 0;
    if (((byte)uVar8 & bVar3) == 1) {
      local_830.v[6] = local_830.v[6] + 1;
      fill_block(&local_c30,&local_830,&local_430,0);
      fill_block(&local_c30,&local_430,&local_430,0);
      uVar9 = 2;
    }
    else {
      uVar9 = (uint)bVar3 * 2;
    }
    if (uVar9 < instance->segment_length) {
      uVar1 = instance->lane_length;
      uVar6 = instance->segment_length * (uint)local_c50.slice + local_c50.lane * uVar1;
      local_c38 = (ulong)uVar6;
      uVar6 = uVar6 + uVar9;
      uVar6 = (-(uint)(uVar6 % uVar1 != 0) | uVar1 - 1) + uVar6;
      local_c40 = (uint)uVar8;
      do {
        local_c3c = (int)local_c38 + uVar9;
        uVar1 = (int)local_c38 + -1 + uVar9;
        if (local_c3c % instance->lane_length != 1) {
          uVar1 = uVar6;
        }
        if ((char)uVar8 == '\0') {
          puVar5 = instance->memory[uVar1].v;
        }
        else {
          if ((uVar9 & 0x7f) == 0) {
            local_830.v[6] = local_830.v[6] + 1;
            fill_block(&local_c30,&local_830,&local_430,0);
            fill_block(&local_c30,&local_430,&local_430,0);
          }
          puVar5 = local_430.v + (uVar9 & 0x7f);
        }
        uVar6 = 0;
        uVar7 = (*puVar5 >> 0x20) % (ulong)instance->lanes;
        uVar8 = uVar7;
        if (local_c50.slice == '\0') {
          uVar8 = (ulong)local_c50._0_8_ >> 0x20;
        }
        if (local_c50.pass != 0) {
          uVar8 = uVar7;
        }
        local_c50.index = uVar9;
        uVar4 = index_alpha(instance,&local_c50,(uint32_t)*puVar5,
                            (uint)(uVar8 == (ulong)local_c50._0_8_ >> 0x20));
        pbVar2 = instance->memory;
        if (local_c50.pass != 0) {
          uVar6 = (uint)(instance->version != 0x10);
        }
        fill_block(pbVar2 + uVar1,pbVar2 + uVar8 * instance->lane_length + (ulong)uVar4,
                   pbVar2 + local_c3c,uVar6);
        uVar9 = uVar9 + 1;
        uVar6 = uVar1 + 1;
        uVar8 = (ulong)local_c40;
      } while (uVar9 < instance->segment_length);
    }
  }
  return;
}

Assistant:

void fill_segment_default(const argon2_instance_t *instance,
                          argon2_position_t position)
{
    fill_segment_64(instance, position);
}